

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O2

int testSpanTestsMakeSpanArrayImmutable(void)

{
  return 0;
}

Assistant:

int testSpanTestsMakeSpanArrayImmutable()
{
    const std::array<int, 4> values = {{1, 2, 3, 4}};
    auto span = MakeSpan(values);
    static_assert(std::is_same<decltype(span)::value_type, decltype(span)::const_value_type>::value,
                  "MakeSpan should make const T");

    ML_ASSERT(!span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(4));
    ML_ASSERT_EQ(span.Data(), values.data());
    ML_ASSERT_EQ(span.Get<0>(), 1);

    return 0;
}